

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O2

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  long in_FS_OFFSET;
  pair<int,_leveldb::FileMetaData> local_d8;
  FileMetaData local_78;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.refs = 0;
  local_78.allowed_seeks = 0x40000000;
  local_78.smallest.rep_._M_dataplus._M_p = (pointer)&local_78.smallest.rep_.field_2;
  local_78.smallest.rep_._M_string_length = 0;
  local_78.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_78.largest.rep_._M_dataplus._M_p = (pointer)&local_78.largest.rep_.field_2;
  local_78.largest.rep_._M_string_length = 0;
  local_78.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_78.number = file;
  local_78.file_size = file_size;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_78.smallest.rep_,&smallest->rep_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_78.largest.rep_,&largest->rep_);
  local_d8.first = level;
  FileMetaData::FileMetaData(&local_d8.second,&local_78);
  std::
  vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
  ::emplace_back<std::pair<int,leveldb::FileMetaData>>
            ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
              *)&this->new_files_,&local_d8);
  FileMetaData::~FileMetaData(&local_d8.second);
  FileMetaData::~FileMetaData(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }